

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void * get_new(t_symbol *why,int argc,t_atom *argv)

{
  t_object *owner;
  t_symbol *ptVar1;
  t_pd p_Var2;
  _binbuf *p_Var3;
  _outlet *p_Var4;
  _binbuf *local_50;
  t_getvariable *sp;
  t_atom *varvec;
  t_atom at;
  int i;
  int varcount;
  t_get *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *why_local;
  
  owner = (t_object *)pd_new(get_class);
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  p_Var2 = (t_pd)template_getbindsym(ptVar1);
  owner[1].te_g.g_pd = p_Var2;
  if (argc < 2) {
    at.a_w._4_4_ = 1;
    sp = (t_getvariable *)&varvec;
    varvec._0_4_ = 2;
    at._0_8_ = &s_;
  }
  else {
    at.a_w._4_4_ = argc + -1;
    sp = (t_getvariable *)(argv + 1);
  }
  p_Var3 = (_binbuf *)getbytes((long)(int)at.a_w._4_4_ << 4);
  owner[1].te_binbuf = p_Var3;
  *(undefined4 *)&owner[1].te_g.g_next = at.a_w._4_4_;
  at.a_w.w_float = 0.0;
  local_50 = owner[1].te_binbuf;
  for (; at.a_w.w_index < (int)at.a_w._4_4_; at.a_w.w_index = at.a_w.w_index + 1) {
    ptVar1 = atom_getsymbolarg(at.a_w.w_index,at.a_w._4_4_,(t_atom *)sp);
    *(t_symbol **)local_50 = ptVar1;
    p_Var4 = outlet_new(owner,(t_symbol *)0x0);
    local_50->b_vec = (t_atom *)p_Var4;
    local_50 = local_50 + 1;
  }
  return owner;
}

Assistant:

static void *get_new(t_symbol *why, int argc, t_atom *argv)
{
    t_get *x = (t_get *)pd_new(get_class);
    int varcount, i;
    t_atom at, *varvec;
    t_getvariable *sp;

    x->x_templatesym = template_getbindsym(atom_getsymbolarg(0, argc, argv));
    if (argc < 2)
    {
        varcount = 1;
        varvec = &at;
        SETSYMBOL(&at, &s_);
    }
    else varcount = argc - 1, varvec = argv + 1;
    x->x_variables
        = (t_getvariable *)getbytes(varcount * sizeof (*x->x_variables));
    x->x_nout = varcount;
    for (i = 0, sp = x->x_variables; i < varcount; i++, sp++)
    {
        sp->gv_sym = atom_getsymbolarg(i, varcount, varvec);
        sp->gv_outlet = outlet_new(&x->x_obj, 0);
            /* LATER connect with the template and set the outlet's type
            correctly.  We can't yet guarantee that the template is there
            before we hit this routine. */
    }
    return (x);
}